

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall
flatbuffers::Parser::ParseTable(Parser *this,StructDef *struct_def,string *value,uoffset_t *ovalue)

{
  FlatBufferBuilderImpl<false> *this_00;
  Parser *this_01;
  uoffset_t *puVar1;
  string **ppsVar2;
  voffset_t vVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  _Base_ptr p_Var4;
  void *__src;
  string *psVar5;
  CheckedError CVar6;
  CheckedError CVar7;
  const_iterator cVar8;
  bool bVar9;
  int iVar10;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> t;
  int iVar11;
  uint uVar12;
  Offset<void> OVar13;
  uoffset_t uVar14;
  const_iterator cVar15;
  long *plVar16;
  size_t len;
  const_iterator __position;
  long *plVar17;
  StructDef *struct_def_00;
  char cVar18;
  pointer pcVar19;
  int t_00;
  pointer v;
  undefined8 uVar20;
  long lVar21;
  _Alloc_hider _Var22;
  string *psVar23;
  Parser *pPVar24;
  uoffset_t *in_R8;
  CheckedError *ce;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  FieldDef *__rhs_00;
  Value *pVVar26;
  Value *val_00;
  bool bVar27;
  CheckedError err;
  StructDef *local_1a0;
  Builder builder;
  Value val;
  pointer local_b0;
  string name;
  int local_88;
  string local_60;
  SymbolTable<flatbuffers::FieldDef> *local_40;
  string *local_38;
  
  iVar11 = *(int *)&struct_def[5].field_0x114;
  if (0x40 < iVar11) {
    __assert_fail("caller_depth_ <= (FLATBUFFERS_MAX_PARSING_DEPTH) && \"Check() must be called to prevent stack overflow\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                  ,0x19d,"flatbuffers::Parser::ParseDepthGuard::ParseDepthGuard(Parser *)");
  }
  *(int *)&struct_def[5].field_0x114 = iVar11 + 1;
  if (iVar11 == 0x40) {
    RecurseError(this);
  }
  else {
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a70;
  iVar11 = *(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc);
  t_00 = (int)struct_def;
  local_38 = (string *)ovalue;
  if (iVar11 == 0x5b) {
    Next((Parser *)&err);
    local_88 = 0x5d;
  }
  else {
    Expect((Parser *)&err,t_00);
    local_88 = 0x7d;
  }
  err.has_been_checked_ = true;
  if (err.is_error_ == false) {
    this_00 = (FlatBufferBuilderImpl<false> *)
              &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
               _M_node_count;
    local_40 = &struct_def[5].fields;
    local_1a0 = (StructDef *)0x0;
    do {
      paVar25 = &name.field_2;
      if (((byte)(local_1a0 == (StructDef *)0x0 |
                 struct_def[3].super_Definition.name.field_2._M_local_buf[2] ^ 1U) == 1) &&
         (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == local_88))
      goto LAB_001119e9;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      name._M_dataplus._M_p = (pointer)paVar25;
      if (iVar11 == 0x5b) {
        if (local_1a0 <
            (StructDef *)
            ((long)value[8]._M_dataplus._M_p - *(long *)((long)&value[7].field_2 + 8) >> 3)) {
          std::__cxx11::string::_M_assign((string *)&name);
          goto LAB_00111403;
        }
        builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&builder.buf_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        val.type.base_type = 0x27;
        val.type.element = BASE_TYPE_NONE;
        builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)std::__cxx11::string::_M_create((ulong *)&builder,(ulong)&val);
        builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)val.type._0_8_;
        builtin_memcpy(builder.buf_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,"too many unnamed fields in nested array",
                       0x27);
        builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)val.type._0_8_;
        builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[val.type._0_8_] = '\0';
        Error((Parser *)&err,(string *)struct_def);
        if ((pointer *)
            builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(builder.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (ulong)(builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        cVar18 = '\x01';
      }
      else {
        std::__cxx11::string::_M_assign((string *)&name);
        if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x101) {
          Next((Parser *)&err);
        }
        else {
          Expect((Parser *)&err,t_00);
        }
        err.has_been_checked_ = true;
        if (err.is_error_ == false) {
          if (((char)struct_def[4].super_Definition.file._M_string_length != '\x01') ||
             ((*(uint *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) | 0x20) != 0x7b))
          {
            Expect((Parser *)&err,t_00);
            err.has_been_checked_ = true;
            if (err.is_error_ != false) goto LAB_001113f6;
          }
LAB_00111403:
          iVar10 = std::__cxx11::string::compare((char *)&name);
          if (iVar10 == 0) {
            Expect((Parser *)&err,t_00);
            CVar6 = err;
            err = (CheckedError)((ushort)err & 0xff);
            CVar7 = err;
            err.is_error_ = CVar6.is_error_;
            bVar27 = err.is_error_ == false;
            err = CVar7;
            if (bVar27) {
              err.is_error_ = false;
              err.has_been_checked_ = false;
            }
LAB_00111798:
          }
          else {
            cVar15 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                             *)&value[6]._M_string_length,&name);
            if (cVar15._M_node == (_Base_ptr)&value[6].field_2) {
              __rhs_00 = (FieldDef *)0x0;
            }
            else {
              __rhs_00 = *(FieldDef **)(cVar15._M_node + 2);
            }
            if (__rhs_00 != (FieldDef *)0x0) {
              if (((*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) &&
                  (iVar10 = std::__cxx11::string::compare
                                      ((char *)&(struct_def->super_Definition).file._M_string_length
                                      ), iVar10 == 0)) &&
                 (0xb < (__rhs_00->value).type.base_type - BASE_TYPE_UTYPE)) {
                Next((Parser *)&err);
                goto LAB_001119c0;
              }
              val.type.base_type = (__rhs_00->value).type.base_type;
              val.type.element = (__rhs_00->value).type.element;
              val.type.struct_def = (__rhs_00->value).type.struct_def;
              val.type.enum_def = (__rhs_00->value).type.enum_def;
              val.type.fixed_length = (__rhs_00->value).type.fixed_length;
              val.type._26_6_ = *(undefined6 *)&(__rhs_00->value).type.field_0x1a;
              val.constant._M_dataplus._M_p = (pointer)&val.constant.field_2;
              pcVar19 = (__rhs_00->value).constant._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&val.constant,pcVar19,
                         pcVar19 + (__rhs_00->value).constant._M_string_length);
              val.offset = (__rhs_00->value).offset;
              if (__rhs_00->flexbuffer == true) {
                flexbuffers::Builder::Builder(&builder,0x400,BUILDER_FLAG_SHARE_ALL);
                ParseFlexBufferValue((Parser *)&err,(Builder *)struct_def);
                err.has_been_checked_ = true;
                if (err.is_error_ == false) {
                  flexbuffers::Builder::Finish(&builder);
                  if (builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    if (struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_right < (_Base_ptr)0x8) {
                      struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_right = (_Base_ptr)0x8;
                    }
                    vector_downward<unsigned_int>::fill
                              ((vector_downward<unsigned_int> *)this_00,
                               (ulong)((int)builder.buf_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                       ((int)builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish +
                                       struct_def[1].super_Definition.serialized_location) & 7));
                  }
                  if (builder.finished_ == false) {
                    __assert_fail("finished_",
                                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                                  ,0x592,"void flexbuffers::Builder::Finished() const");
                  }
                  v = builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start;
                  if ((long)builder.buf_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)builder.buf_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start == 0) {
                    v = &data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
                         ::t;
                  }
                  t = FlatBufferBuilderImpl<false>::
                      CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>
                                (this_00,v,
                                 (long)builder.buf_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)builder.buf_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                  NumToString<unsigned_int>(&local_60,t.o);
                  std::__cxx11::string::operator=((string *)&val.constant,(string *)&local_60);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_60._M_dataplus._M_p != &local_60.field_2) {
                    operator_delete(local_60._M_dataplus._M_p,
                                    (ulong)(local_60.field_2._M_allocated_capacity + 1));
                  }
                  std::
                  _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>,_std::_Identity<std::pair<unsigned_long,_unsigned_long>_>,_flexbuffers::Builder::StringOffsetCompare,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::~_Rb_tree(&builder.string_pool._M_t);
                  std::
                  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_flexbuffers::Builder::KeyOffsetCompare,_std::allocator<unsigned_long>_>
                  ::~_Rb_tree(&builder.key_pool._M_t);
                  if (builder.stack_.
                      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(builder.stack_.
                                    super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)builder.stack_.
                                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)builder.stack_.
                                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(builder.buf_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)builder.buf_.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)builder.buf_.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
LAB_0011182c:
                  cVar8._M_current =
                       *(pair<flatbuffers::Value,_flatbuffers::FieldDef_*> **)
                        &struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header;
                  do {
                    __position._M_current = cVar8._M_current;
                    if (__position._M_current ==
                        (pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)
                        ((long)local_1a0 * -0x50 +
                        *(long *)&struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header.
                                  _M_header)) goto LAB_001118e0;
                    if (__position._M_current[-1].second == __rhs_00) {
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&builder,"field set more than once: ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__rhs_00);
                      Error((Parser *)&err,(string *)struct_def);
                      if ((pointer *)
                          builder.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start !=
                          &builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(builder.buf_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (ulong)(builder.buf_.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                               1));
                      }
                      cVar18 = '\x01';
                    }
                    else {
                      cVar18 = (((__position._M_current[-1].second)->value).offset <
                               (__rhs_00->value).offset) * '\x02';
                    }
                    cVar8._M_current = __position._M_current + -1;
                  } while (cVar18 == '\0');
                  if (cVar18 == '\x02') {
LAB_001118e0:
                    builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)val.type.enum_def;
                    builder.stack_.
                    super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)val.type._24_8_;
                    builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)val.type._0_8_;
                    builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)val.type.struct_def;
                    builder.stack_.
                    super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&builder.finished_;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)
                               &builder.stack_.
                                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                               val.constant._M_dataplus._M_p,
                               val.constant._M_dataplus._M_p + val.constant._M_string_length);
                    builder.key_pool._M_t._M_impl.
                    super__Rb_tree_key_compare<flexbuffers::Builder::KeyOffsetCompare>.
                    _M_key_compare.buf_._0_2_ = val.offset;
                    builder.key_pool._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = __rhs_00;
                    std::
                    vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                    ::_M_insert_rval((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                                      *)local_40,__position,(value_type *)&builder);
                    if (builder.stack_.
                        super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                        ._M_impl.super__Vector_impl_data._M_finish != (pointer)&builder.finished_) {
                      operator_delete(builder.stack_.
                                      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      CONCAT71(builder._49_7_,builder.finished_) + 1);
                    }
                    local_1a0 = (StructDef *)
                                ((long)&(local_1a0->super_Definition).name._M_dataplus._M_p + 1);
                    bVar27 = true;
                  }
                  else {
                    bVar27 = false;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)val.constant._M_dataplus._M_p != &val.constant.field_2) {
                    operator_delete(val.constant._M_dataplus._M_p,
                                    val.constant.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar27) goto LAB_001119d8;
                  goto LAB_001117a0;
                }
                std::
                _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>,_std::_Identity<std::pair<unsigned_long,_unsigned_long>_>,_flexbuffers::Builder::StringOffsetCompare,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ::~_Rb_tree(&builder.string_pool._M_t);
                std::
                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_flexbuffers::Builder::KeyOffsetCompare,_std::allocator<unsigned_long>_>
                ::~_Rb_tree(&builder.key_pool._M_t);
                if (builder.stack_.
                    super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(builder.stack_.
                                  super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)builder.stack_.
                                        super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)builder.stack_.
                                        super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)builder.buf_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)builder.buf_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
              }
              else {
                if (__rhs_00->nested_flatbuffer == (StructDef *)0x0) {
                  ParseAnyValue((Parser *)&err,(Value *)struct_def,(FieldDef *)&val,(size_t)__rhs_00
                                ,local_1a0,(size_t)value,false);
                }
                else {
                  ParseNestedFlatbuffer
                            ((Parser *)&err,(Value *)struct_def,(FieldDef *)&val,(size_t)__rhs_00,
                             local_1a0);
                }
                err.has_been_checked_ = true;
                if (err.is_error_ == false) goto LAB_0011182c;
              }
              uVar20 = val.constant.field_2._M_allocated_capacity;
              _Var22._M_p = val.constant._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)val.constant._M_dataplus._M_p != &val.constant.field_2) goto LAB_00111790;
              goto LAB_00111798;
            }
            if (*(char *)((long)&struct_def[3].super_Definition.file._M_dataplus._M_p + 4) == '\0')
            {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &builder,"unknown field: ",&name);
              Error((Parser *)&err,(string *)struct_def);
              uVar20 = builder.buf_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              _Var22._M_p = (pointer)builder.buf_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
              if ((pointer *)
                  builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  &builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00111798;
LAB_00111790:
              operator_delete(_Var22._M_p,(ulong)(uVar20 + 1));
              goto LAB_00111798;
            }
            SkipAnyJsonValue((Parser *)&err);
LAB_001119c0:
            if (err.is_error_ == false) {
LAB_001119d8:
              err.is_error_ = false;
            }
          }
LAB_001117a0:
          err.has_been_checked_ = true;
          cVar18 = '\x01';
          if ((err.is_error_ == false) &&
             (cVar18 = '\x02',
             *(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != local_88)) {
            if ((char)struct_def[4].super_Definition.file._M_string_length == '\0') {
              Expect((Parser *)&err,t_00);
              if (err.is_error_ == false) goto LAB_001117f1;
            }
            else {
LAB_001117f1:
              err.is_error_ = false;
            }
            err.has_been_checked_ = true;
            cVar18 = err.is_error_;
          }
        }
        else {
LAB_001113f6:
          cVar18 = '\x01';
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,
                        CONCAT71(name.field_2._M_allocated_capacity._1_7_,
                                 name.field_2._M_local_buf[0]) + 1);
      }
    } while (cVar18 == '\0');
    if (cVar18 == '\x02') {
LAB_001119e9:
      Next((Parser *)&err);
      err.has_been_checked_ = true;
      if (err.is_error_ == false) {
        if ((iVar11 == 0x5b) &&
           (local_1a0 !=
            (StructDef *)
            ((long)value[8]._M_dataplus._M_p - *(long *)((long)&value[7].field_2 + 8) >> 3))) {
          builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&builder.buf_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          val.type.base_type = 0x2e;
          val.type.element = BASE_TYPE_NONE;
          builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)std::__cxx11::string::_M_create((ulong *)&builder,(ulong)&val);
          builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)val.type._0_8_;
          builtin_memcpy(builder.buf_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         "wrong number of unnamed fields in table vector",0x2e);
          builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)val.type._0_8_;
          builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[val.type._0_8_] = '\0';
          Error((Parser *)&err,(string *)struct_def);
          if ((pointer *)
              builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_start !=
              &builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(builder.buf_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (ulong)(builder.buf_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
        }
        else {
          err.is_error_ = false;
          err.has_been_checked_ = false;
        }
      }
    }
  }
  else {
    local_1a0 = (StructDef *)0x0;
  }
  *(bool *)&(this->super_ParserState).prev_cursor_ = err.is_error_;
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 0;
  err.has_been_checked_ = true;
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (err.is_error_ == false) {
    pcVar19 = *(pointer *)((long)&value[7].field_2 + 8);
    if (pcVar19 != value[8]._M_dataplus._M_p) {
      do {
        __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pcVar19;
        bVar27 = false;
        if (*(int *)((long)&__rhs[8].field_2 + 8) == 0) {
          if ((long)local_1a0 * -0x50 != 0) {
            bVar9 = false;
            lVar21 = (long)local_1a0 * -0x50;
            do {
              if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   (*(long *)&struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header
                    + 0x48 + lVar21) == __rhs) {
                bVar9 = true;
                break;
              }
              bVar27 = lVar21 != -0x50;
              lVar21 = lVar21 + 0x50;
            } while (bVar27);
            bVar27 = false;
            if (bVar9) goto LAB_00111c63;
          }
          std::operator+(&local_60,"required field is missing: ",__rhs);
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_60);
          val.type._0_8_ = &val.type.enum_def;
          plVar17 = plVar16 + 2;
          if ((long *)*plVar16 == plVar17) {
            val.type.enum_def = (EnumDef *)*plVar17;
            val.type._24_8_ = plVar16[3];
          }
          else {
            val.type.enum_def = (EnumDef *)*plVar17;
            val.type._0_8_ = (long *)*plVar16;
          }
          val.type.struct_def = (StructDef *)plVar16[1];
          *plVar16 = (long)plVar17;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          plVar16 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&val,(ulong)(value->_M_dataplus)._M_p);
          builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&builder.buf_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          plVar17 = plVar16 + 2;
          if ((long *)*plVar16 == plVar17) {
            builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
            builder.stack_.
            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar16[3];
          }
          else {
            builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
            builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar16;
          }
          builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)plVar16[1];
          *plVar16 = (long)plVar17;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          Error(this,(string *)struct_def);
          if ((pointer *)
              builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_start !=
              &builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(builder.buf_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (ulong)(builder.buf_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          if ((EnumDef **)val.type._0_8_ != &val.type.enum_def) {
            operator_delete((void *)val.type._0_8_,
                            (ulong)((long)&((val.type.enum_def)->super_Definition).name._M_dataplus.
                                           _M_p + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,
                            (ulong)(local_60.field_2._M_allocated_capacity + 1));
          }
          bVar27 = true;
        }
LAB_00111c63:
        if (bVar27) goto LAB_00111a60;
        pcVar19 = pcVar19 + 8;
      } while (pcVar19 != value[8]._M_dataplus._M_p);
    }
    if (value[8].field_2._M_local_buf[0] == '\x01') {
      if (local_1a0 !=
          (StructDef *)
          ((long)value[8]._M_dataplus._M_p - *(long *)((long)&value[7].field_2 + 8) >> 3)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builder
                       ,"struct: wrong number of initializers: ",value);
        Error(this,(string *)struct_def);
        if ((pointer *)
            builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(builder.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (ulong)(builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        goto LAB_00111a60;
      }
      p_Var4 = *(_Base_ptr *)((long)&value[8].field_2 + 8);
      if (struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right < p_Var4)
      {
        struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var4;
      }
      vector_downward<unsigned_int>::fill
                ((vector_downward<unsigned_int> *)
                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,
                 (ulong)((long)&p_Var4[-1]._M_right + 7) &
                 -(ulong)struct_def[1].super_Definition.serialized_location);
    }
    else {
      FlatBufferBuilderImpl<false>::NotNested
                ((FlatBufferBuilderImpl<false> *)
                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
      *(undefined1 *)&struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left
           = 1;
    }
    uVar14 = struct_def[1].super_Definition.serialized_location;
    local_b0 = (pointer)0x1;
    if (value[8].field_2._M_local_buf[2] != '\0') {
      local_b0 = (pointer)0x8;
    }
    this_01 = (Parser *)
              &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
               _M_node_count;
    do {
      if ((long)local_1a0 * -0x50 != 0) {
        pVVar26 = *(Value **)&struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header
        ;
        do {
          val_00 = (Value *)((long)(pVVar26 + 0xfffffffffffffffe) + 0x40);
          lVar21 = *(long *)((long)(pVVar26 + 0xffffffffffffffff) + 0x40);
          if (value[8].field_2._M_local_buf[2] == '\x01') {
            if (0x12 < (ulong)(val_00->type).base_type) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                            ,0x9f,"size_t flatbuffers::SizeOf(const BaseType)");
            }
            if (local_b0 == *(pointer *)(&DAT_001b5290 + (ulong)(val_00->type).base_type * 8))
            goto LAB_00111db0;
          }
          else {
LAB_00111db0:
            pPVar24 = this_01;
            switch((val_00->type).base_type) {
            case 0:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar21 + 200) - 1U < 0xc) && (*(int *)(lVar21 + 0x118) == 1)) {
                iVar11 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U));
                if (iVar11 != 0) {
                  anon_unknown_0::atot<unsigned_char>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(uchar *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                  vVar3 = *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38);
                  uVar12 = FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (uchar)builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar3,uVar12);
                }
              }
              else {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,*(char **)(lVar21 + 0xe8),(Parser *)struct_def,
                           (uchar *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (undefined1)val.type.base_type);
              }
              break;
            case 1:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar21 + 200) - 1U < 0xc) && (*(int *)(lVar21 + 0x118) == 1)) {
                iVar11 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U));
                if (iVar11 != 0) {
                  anon_unknown_0::atot<unsigned_char>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(uchar *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                  vVar3 = *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38);
                  uVar12 = FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (uchar)builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar3,uVar12);
                }
              }
              else {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,*(char **)(lVar21 + 0xe8),(Parser *)struct_def,
                           (uchar *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (undefined1)val.type.base_type);
              }
              break;
            case 2:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar21 + 200) - 1U < 0xc) && (*(int *)(lVar21 + 0x118) == 1)) {
                iVar11 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U));
                if (iVar11 != 0) {
                  anon_unknown_0::atot<unsigned_char>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(uchar *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                  vVar3 = *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38);
                  uVar12 = FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (uchar)builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar3,uVar12);
                }
              }
              else {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,*(char **)(lVar21 + 0xe8),(Parser *)struct_def,
                           (uchar *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (undefined1)val.type.base_type);
              }
              break;
            case 3:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<signed_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(char *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar21 + 200) - 1U < 0xc) && (*(int *)(lVar21 + 0x118) == 1)) {
                iVar11 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U));
                if (iVar11 != 0) {
                  anon_unknown_0::atot<signed_char>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(char *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                  vVar3 = *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38);
                  uVar12 = FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (uchar)builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar3,uVar12);
                }
              }
              else {
                anon_unknown_0::atot<signed_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(char *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                anon_unknown_0::atot<signed_char>
                          ((anon_unknown_0 *)this,*(char **)(lVar21 + 0xe8),(Parser *)struct_def,
                           (char *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::AddElement<signed_char>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (undefined1)val.type.base_type);
              }
              break;
            case 4:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar21 + 200) - 1U < 0xc) && (*(int *)(lVar21 + 0x118) == 1)) {
                iVar11 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U));
                if (iVar11 != 0) {
                  anon_unknown_0::atot<unsigned_char>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(uchar *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                  vVar3 = *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38);
                  uVar12 = FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (uchar)builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar3,uVar12);
                }
              }
              else {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,*(char **)(lVar21 + 0xe8),(Parser *)struct_def,
                           (uchar *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (undefined1)val.type.base_type);
              }
              break;
            case 5:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<short>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(short *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (unsigned_short)
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar21 + 200) - 1U < 0xc) && (*(int *)(lVar21 + 0x118) == 1)) {
                iVar11 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U));
                if (iVar11 != 0) {
                  anon_unknown_0::atot<short>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(short *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                  vVar3 = *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38);
                  uVar12 = FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (unsigned_short)
                                      builder.buf_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar3,uVar12);
                }
              }
              else {
                anon_unknown_0::atot<short>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(short *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                anon_unknown_0::atot<short>
                          ((anon_unknown_0 *)this,*(char **)(lVar21 + 0xe8),(Parser *)struct_def,
                           (short *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::AddElement<short>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (unsigned_short)
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,(undefined2)val.type.base_type);
              }
              break;
            case 6:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<unsigned_short>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(unsigned_short *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::PushElement<unsigned_short,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (unsigned_short)
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar21 + 200) - 1U < 0xc) && (*(int *)(lVar21 + 0x118) == 1)) {
                iVar11 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U));
                if (iVar11 != 0) {
                  anon_unknown_0::atot<unsigned_short>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(unsigned_short *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                  vVar3 = *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38);
                  uVar12 = FlatBufferBuilderImpl<false>::PushElement<unsigned_short,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (unsigned_short)
                                      builder.buf_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar3,uVar12);
                }
              }
              else {
                anon_unknown_0::atot<unsigned_short>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(unsigned_short *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                anon_unknown_0::atot<unsigned_short>
                          ((anon_unknown_0 *)this,*(char **)(lVar21 + 0xe8),(Parser *)struct_def,
                           (unsigned_short *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::AddElement<unsigned_short>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (unsigned_short)
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,(undefined2)val.type.base_type);
              }
              break;
            case 7:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<int>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(int *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (int)builder.buf_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_);
              }
              else if ((*(int *)(lVar21 + 200) - 1U < 0xc) && (*(int *)(lVar21 + 0x118) == 1)) {
                iVar11 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U));
                if (iVar11 != 0) {
                  anon_unknown_0::atot<int>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(int *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                  vVar3 = *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38);
                  uVar12 = FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (int)builder.buf_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_4_);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar3,uVar12);
                }
              }
              else {
                anon_unknown_0::atot<int>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(int *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                anon_unknown_0::atot<int>
                          ((anon_unknown_0 *)this,*(char **)(lVar21 + 0xe8),(Parser *)struct_def,
                           (int *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::AddElement<int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (int)builder.buf_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_,val.type.base_type);
              }
              break;
            case 8:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<unsigned_int>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uint *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (uint)builder.buf_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_);
              }
              else if ((*(int *)(lVar21 + 200) - 1U < 0xc) && (*(int *)(lVar21 + 0x118) == 1)) {
                iVar11 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U));
                if (iVar11 != 0) {
                  anon_unknown_0::atot<unsigned_int>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(uint *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                  vVar3 = *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38);
                  uVar12 = FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (uint)builder.buf_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar3,uVar12);
                }
              }
              else {
                anon_unknown_0::atot<unsigned_int>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uint *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                anon_unknown_0::atot<unsigned_int>
                          ((anon_unknown_0 *)this,*(char **)(lVar21 + 0xe8),(Parser *)struct_def,
                           (uint *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::AddElement<unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (uint)builder.buf_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_,val.type.base_type);
              }
              break;
            case 9:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<long>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(long *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::PushElement<long,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (long)builder.buf_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar21 + 200) - 1U < 0xc) && (*(int *)(lVar21 + 0x118) == 1)) {
                iVar11 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U));
                if (iVar11 != 0) {
                  anon_unknown_0::atot<long>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(long *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                  vVar3 = *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38);
                  uVar12 = FlatBufferBuilderImpl<false>::PushElement<long,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (long)builder.buf_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar3,uVar12);
                }
              }
              else {
                anon_unknown_0::atot<long>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(long *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                anon_unknown_0::atot<long>
                          ((anon_unknown_0 *)this,*(char **)(lVar21 + 0xe8),(Parser *)struct_def,
                           (long *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::AddElement<long>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (long)builder.buf_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,val.type._0_8_);
              }
              break;
            case 10:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<unsigned_long>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(unsigned_long *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (unsigned_long)
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar21 + 200) - 1U < 0xc) && (*(int *)(lVar21 + 0x118) == 1)) {
                iVar11 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U));
                if (iVar11 != 0) {
                  anon_unknown_0::atot<unsigned_long>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(unsigned_long *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                  vVar3 = *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38);
                  uVar12 = FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (unsigned_long)
                                      builder.buf_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar3,uVar12);
                }
              }
              else {
                anon_unknown_0::atot<unsigned_long>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(unsigned_long *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                anon_unknown_0::atot<unsigned_long>
                          ((anon_unknown_0 *)this,*(char **)(lVar21 + 0xe8),(Parser *)struct_def,
                           (unsigned_long *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::AddElement<unsigned_long>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (unsigned_long)
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,val.type._0_8_);
              }
              break;
            case 0xb:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<float>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(float *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::PushElement<float,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_);
              }
              else if ((*(int *)(lVar21 + 200) - 1U < 0xc) && (*(int *)(lVar21 + 0x118) == 1)) {
                iVar11 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U));
                if (iVar11 != 0) {
                  anon_unknown_0::atot<float>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(float *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                  vVar3 = *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38);
                  uVar12 = FlatBufferBuilderImpl<false>::PushElement<float,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      builder.buf_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar3,uVar12);
                }
              }
              else {
                anon_unknown_0::atot<float>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(float *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                anon_unknown_0::atot<float>
                          ((anon_unknown_0 *)this,*(char **)(lVar21 + 0xe8),(Parser *)struct_def,
                           (float *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::AddElement<float>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_,(float)val.type.base_type);
              }
              break;
            case 0xc:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<double>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(double *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::PushElement<double,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (double)builder.buf_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar21 + 200) - 1U < 0xc) && (*(int *)(lVar21 + 0x118) == 1)) {
                iVar11 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U));
                if (iVar11 != 0) {
                  anon_unknown_0::atot<double>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(double *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                  vVar3 = *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38);
                  uVar12 = FlatBufferBuilderImpl<false>::PushElement<double,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (double)builder.buf_.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar3,uVar12);
                }
              }
              else {
                anon_unknown_0::atot<double>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(double *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                anon_unknown_0::atot<double>
                          ((anon_unknown_0 *)this,*(char **)(lVar21 + 0xe8),(Parser *)struct_def,
                           (double *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a60;
                FlatBufferBuilderImpl<false>::AddElement<double>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (double)builder.buf_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,(double)val.type._0_8_)
                ;
              }
              break;
            case 0xd:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if ((*(int *)(lVar21 + 200) == 0xf) &&
                 (struct_def_00 = *(StructDef **)(lVar21 + 0xd0), struct_def_00->fixed != false)) {
LAB_0011242b:
                SerializeStruct(pPVar24,(FlatBufferBuilder *)this_01,struct_def_00,val_00);
              }
              else if (*(char *)(lVar21 + 0x115) == '\x01') {
                iVar11 = atoi(*(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (Offset64<void>)(long)iVar11);
              }
              else {
                OVar13.o = atoi(*(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),OVar13);
              }
              break;
            case 0xe:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if ((*(int *)(lVar21 + 200) == 0xf) &&
                 (struct_def_00 = *(StructDef **)(lVar21 + 0xd0), struct_def_00->fixed != false))
              goto LAB_0011242b;
              if (*(char *)(lVar21 + 0x115) == '\x01') {
                iVar11 = atoi(*(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (Offset64<void>)(long)iVar11);
              }
              else {
                OVar13.o = atoi(*(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),OVar13);
              }
              break;
            case 0xf:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if ((*(int *)(lVar21 + 200) == 0xf) &&
                 (struct_def_00 = *(StructDef **)(lVar21 + 0xd0), struct_def_00->fixed != false))
              goto LAB_0011242b;
              if (*(char *)(lVar21 + 0x115) == '\x01') {
                iVar11 = atoi(*(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (Offset64<void>)(long)iVar11);
              }
              else {
                OVar13.o = atoi(*(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),OVar13);
              }
              break;
            case 0x10:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if ((*(int *)(lVar21 + 200) == 0xf) &&
                 (struct_def_00 = *(StructDef **)(lVar21 + 0xd0), struct_def_00->fixed == true))
              goto LAB_0011242b;
              if (*(char *)(lVar21 + 0x115) == '\x01') {
                iVar11 = atoi(*(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (Offset64<void>)(long)iVar11);
              }
              else {
                OVar13.o = atoi(*(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),OVar13);
              }
              break;
            case 0x11:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              __src = *(void **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18);
              len = InlineSize((Type *)val_00);
              if (len != 0) {
                vector_downward<unsigned_int>::ensure_space
                          ((vector_downward<unsigned_int> *)this_01,len);
                psVar23 = (string *)((long)struct_def[1].super_Definition.declaration_file - len);
                struct_def[1].super_Definition.declaration_file = psVar23;
                puVar1 = &struct_def[1].super_Definition.serialized_location;
                *puVar1 = *puVar1 + (int)len;
                memcpy(psVar23,__src,len);
              }
              break;
            case 0x12:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar21 + 0x128));
              if ((*(int *)(lVar21 + 200) == 0xf) &&
                 (struct_def_00 = *(StructDef **)(lVar21 + 0xd0), struct_def_00->fixed != false))
              goto LAB_0011242b;
              if (*(char *)(lVar21 + 0x115) == '\x01') {
                iVar11 = atoi(*(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (Offset64<void>)(long)iVar11);
              }
              else {
                iVar11 = atoi(*(char **)((long)(pVVar26 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar26 + 0xffffffffffffffff) + 0x38),
                           (Offset64<void>)(long)iVar11);
              }
            }
          }
          pVVar26 = val_00;
        } while (val_00 != (Value *)((long)local_1a0 * -0x50 +
                                    *(long *)&struct_def[5].fields.dict._M_t._M_impl.
                                              super__Rb_tree_header._M_header));
      }
      psVar23 = local_38;
      bVar27 = (pointer)0x1 < local_b0;
      local_b0 = (pointer)((ulong)local_b0 >> 1);
    } while (bVar27);
    for (; local_1a0 != (StructDef *)0x0;
        local_1a0 = (StructDef *)
                    ((long)&local_1a0[-1].reserved_ids.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 7)) {
      lVar21 = *(long *)&struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header;
      *(long *)&struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header =
           lVar21 + -0x50;
      if (*(long **)(lVar21 + -0x30) != (long *)(lVar21 + -0x20)) {
        operator_delete(*(long **)(lVar21 + -0x30),*(long *)(lVar21 + -0x20) + 1);
      }
    }
    if (value[8].field_2._M_local_buf[0] == '\0') {
      uVar14 = FlatBufferBuilderImpl<false>::EndTable
                         ((FlatBufferBuilderImpl<false> *)this_01,uVar14);
      if (in_R8 != (uoffset_t *)0x0) {
        *in_R8 = uVar14;
      }
      if (psVar23 != (string *)0x0) {
        NumToString<unsigned_int>((string *)&builder,uVar14);
        std::__cxx11::string::operator=((string *)psVar23,(string *)&builder);
        if ((pointer *)
            builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(builder.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (ulong)(builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
      }
    }
    else {
      *(ulong *)&struct_def[1].fields.dict._M_t._M_impl =
           *(long *)&struct_def[1].fields.dict._M_t._M_impl +
           (ulong)struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color *
           -8;
      struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      *(undefined2 *)
       &struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 = 0;
      if (psVar23 == (string *)0x0) {
        __assert_fail("value",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                      ,0x676,
                      "CheckedError flatbuffers::Parser::ParseTable(const StructDef &, std::string *, uoffset_t *)"
                     );
      }
      psVar5 = struct_def[1].super_Definition.declaration_file;
      if (psVar5 == (string *)0x0) {
        __assert_fail("cur_",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector_downward.h"
                      ,0xb3,
                      "uint8_t *flatbuffers::vector_downward<>::data() const [SizeT = unsigned int]"
                     );
      }
      std::__cxx11::string::_M_replace
                ((ulong)psVar23,0,(char *)psVar23->_M_string_length,(ulong)psVar5);
      pcVar19 = value[9]._M_dataplus._M_p;
      ppsVar2 = &struct_def[1].super_Definition.declaration_file;
      *ppsVar2 = (string *)(pcVar19 + (long)&((*ppsVar2)->_M_dataplus)._M_p);
      puVar1 = &struct_def[1].super_Definition.serialized_location;
      *puVar1 = *puVar1 - (int)pcVar19;
      if (in_R8 != (uoffset_t *)0x0) {
        __assert_fail("!ovalue",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                      ,0x67d,
                      "CheckedError flatbuffers::Parser::ParseTable(const StructDef &, std::string *, uoffset_t *)"
                     );
      }
    }
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
LAB_00111a60:
  if (err.has_been_checked_ == false) {
    __assert_fail("has_been_checked_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0x3a4,"flatbuffers::CheckedError::~CheckedError()");
  }
LAB_00111a70:
  *(int *)&struct_def[5].field_0x114 = *(int *)&struct_def[5].field_0x114 + -1;
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseTable(const StructDef &struct_def, std::string *value,
                                uoffset_t *ovalue) {
  ParseDepthGuard depth_guard(this);
  ECHECK(depth_guard.Check());

  size_t fieldn_outer = 0;
  auto err = ParseTableDelimiters(
      fieldn_outer, &struct_def,
      [&](const std::string &name, size_t &fieldn,
          const StructDef *struct_def_inner) -> CheckedError {
        if (name == "$schema") {
          ECHECK(Expect(kTokenStringConstant));
          return NoError();
        }
        auto field = struct_def_inner->fields.Lookup(name);
        if (!field) {
          if (!opts.skip_unexpected_fields_in_json) {
            return Error("unknown field: " + name);
          } else {
            ECHECK(SkipAnyJsonValue());
          }
        } else {
          if (IsIdent("null") && !IsScalar(field->value.type.base_type)) {
            ECHECK(Next());  // Ignore this field.
          } else {
            Value val = field->value;
            if (field->flexbuffer) {
              flexbuffers::Builder builder(1024,
                                           flexbuffers::BUILDER_FLAG_SHARE_ALL);
              ECHECK(ParseFlexBufferValue(&builder));
              builder.Finish();
              // Force alignment for nested flexbuffer
              builder_.ForceVectorAlignment(builder.GetSize(), sizeof(uint8_t),
                                            sizeof(largest_scalar_t));
              auto off = builder_.CreateVector(builder.GetBuffer());
              val.constant = NumToString(off.o);
            } else if (field->nested_flatbuffer) {
              ECHECK(
                  ParseNestedFlatbuffer(val, field, fieldn, struct_def_inner));
            } else {
              ECHECK(ParseAnyValue(val, field, fieldn, struct_def_inner, 0));
            }
            // Hardcoded insertion-sort with error-check.
            // If fields are specified in order, then this loop exits
            // immediately.
            auto elem = field_stack_.rbegin();
            for (; elem != field_stack_.rbegin() + fieldn; ++elem) {
              auto existing_field = elem->second;
              if (existing_field == field)
                return Error("field set more than once: " + field->name);
              if (existing_field->value.offset < field->value.offset) break;
            }
            // Note: elem points to before the insertion point, thus .base()
            // points to the correct spot.
            field_stack_.insert(elem.base(), std::make_pair(val, field));
            fieldn++;
          }
        }
        return NoError();
      });
  ECHECK(err);

  // Check if all required fields are parsed.
  for (auto field_it = struct_def.fields.vec.begin();
       field_it != struct_def.fields.vec.end(); ++field_it) {
    auto required_field = *field_it;
    if (!required_field->IsRequired()) { continue; }
    bool found = false;
    for (auto pf_it = field_stack_.end() - fieldn_outer;
         pf_it != field_stack_.end(); ++pf_it) {
      auto parsed_field = pf_it->second;
      if (parsed_field == required_field) {
        found = true;
        break;
      }
    }
    if (!found) {
      return Error("required field is missing: " + required_field->name +
                   " in " + struct_def.name);
    }
  }

  if (struct_def.fixed && fieldn_outer != struct_def.fields.vec.size())
    return Error("struct: wrong number of initializers: " + struct_def.name);

  auto start = struct_def.fixed ? builder_.StartStruct(struct_def.minalign)
                                : builder_.StartTable();

  for (size_t size = struct_def.sortbysize ? sizeof(largest_scalar_t) : 1; size;
       size /= 2) {
    // Go through elements in reverse, since we're building the data backwards.
    // TODO(derekbailey): this doesn't work when there are Offset64 fields, as
    // those have to be built first. So this needs to be changed to iterate over
    // Offset64 then Offset32 fields.
    for (auto it = field_stack_.rbegin();
         it != field_stack_.rbegin() + fieldn_outer; ++it) {
      auto &field_value = it->first;
      auto field = it->second;
      if (!struct_def.sortbysize ||
          size == SizeOf(field_value.type.base_type)) {
        switch (field_value.type.base_type) {
          // clang-format off
          #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
            case BASE_TYPE_ ## ENUM: \
              builder_.Pad(field->padding); \
              if (struct_def.fixed) { \
                CTYPE val; \
                ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                builder_.PushElement(val); \
              } else { \
                if (field->IsScalarOptional()) { \
                  if (field_value.constant != "null") { \
                    CTYPE val; \
                    ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                    builder_.AddElement(field_value.offset, val); \
                  } \
                } else { \
                  CTYPE val, valdef; \
                  ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                  ECHECK(atot(field->value.constant.c_str(), *this, &valdef)); \
                  builder_.AddElement(field_value.offset, val, valdef); \
                } \
              } \
              break;
            FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
          #undef FLATBUFFERS_TD
          #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
            case BASE_TYPE_ ## ENUM: \
              builder_.Pad(field->padding); \
              if (IsStruct(field->value.type)) { \
                SerializeStruct(*field->value.type.struct_def, field_value); \
              } else { \
                /* Special case for fields that use 64-bit addressing */ \
                if(field->offset64) { \
                  Offset64<void> offset; \
                  ECHECK(atot(field_value.constant.c_str(), *this, &offset)); \
                  builder_.AddOffset(field_value.offset, offset); \
                } else { \
                  CTYPE val; \
                  ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                  builder_.AddOffset(field_value.offset, val); \
                } \
              } \
              break;
            FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
          #undef FLATBUFFERS_TD
            case BASE_TYPE_ARRAY:
              builder_.Pad(field->padding);
              builder_.PushBytes(
                reinterpret_cast<const uint8_t*>(field_value.constant.c_str()),
                InlineSize(field_value.type));
              break;
            // clang-format on
        }
      }
    }
  }